

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::combineAnd(OptimizeInstructions *this,Binary *curr)

{
  Op op;
  bool bVar1;
  BinaryOp BVar2;
  Unary *pUVar3;
  Binary *pBVar4;
  Type type;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_140;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_108;
  anon_union_16_6_1532cd5a_for_Literal_0 local_c8;
  undefined8 local_b8;
  Const **local_a8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *local_a0;
  matched_t<wasm::Const_*> local_88;
  Const *cx;
  undefined1 local_78 [8];
  Expression *y;
  undefined1 local_68 [8];
  Const *cy;
  Expression *x;
  Type local_50;
  Binary *by;
  Expression *y_1;
  Binary *bx;
  Expression *x_1;
  
  if (curr->op != AndInt32) {
    __assert_fail("curr->op == AndInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xda5,"Expression *wasm::OptimizeInstructions::combineAnd(Binary *)");
  }
  local_c8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&cy;
  local_108.binder = (matched_t<wasm::Const_*> *)0x0;
  local_108.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)&local_c8;
  local_108._8_4_ = 0x13;
  bVar1 = Match::Internal::
          Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                     *)&local_108,curr->left);
  if (bVar1) {
    local_108.binder = (matched_t<wasm::Const_*> *)0x0;
    local_108.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)&local_140;
    local_108._8_4_ = 0x13;
    local_140.binder = (matched_t<wasm::Binary_*> *)local_78;
    bVar1 = Match::Internal::
            Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                       *)&local_108,curr->right);
    if ((bVar1) &&
       ((Binary *)(cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id
        == (Binary *)((Type *)((long)local_78 + 8))->id)) {
      pUVar3 = Expression::cast<wasm::Unary>(curr->left);
      local_108.binder =
           (matched_t<wasm::Const_*> *)
           (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
      BVar2 = Abstract::getBinary((Type)(cy->super_SpecificExpression<(wasm::Expression::Id)14>).
                                        super_Expression.type.id,Or);
      pBVar4 = Builder::makeBinary((Builder *)&local_108,BVar2,(Expression *)cy,
                                   (Expression *)local_78);
      pUVar3->value = (Expression *)pBVar4;
      return (Expression *)pUVar3;
    }
  }
  local_108.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_108.submatchers.curr.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  cy = (Const *)&bx;
  local_b8 = 0;
  local_a8 = &cy;
  local_108.binder = &local_88;
  local_c8.i64 = (int64_t)(element_type *)&y_1;
  local_a0 = &local_108;
  cx = (Const *)this;
  bVar1 = Match::Internal::
          Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)&local_c8.func,curr->left);
  if (bVar1) {
    local_b8 = 0;
    local_a8 = (Const **)0x0;
    local_78 = (undefined1  [8])&by;
    local_140.binder = (matched_t<wasm::Binary_*> *)&local_50;
    local_140.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
    local_c8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68;
    local_140.submatchers.next.curr =
         (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_78;
    local_140.submatchers.next.next.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
          *)&local_c8;
    bVar1 = Match::Internal::
            Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            ::matches(&local_140,curr->right);
    if ((((!bVar1) || (*(int *)(y_1 + 1) != *(int *)(local_50.id + 0x10))) ||
        ((bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id !=
         (by->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id)) ||
       ((bVar1 = Literal::operator==(&local_88->value,(Literal *)((long)local_68 + 0x10)), !bVar1 ||
        (bVar1 = inversesAnd((OptimizeInstructions *)cx,(Binary *)y_1), !bVar1))))
    goto LAB_00ae409c;
    type.id = (bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
    op = Or;
LAB_00ae4190:
    BVar2 = Abstract::getBinary(type,op);
    *(BinaryOp *)(local_50.id + 0x10) = BVar2;
    *(uintptr_t *)(local_50.id + 8) =
         (bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
    *(Binary **)(local_50.id + 0x18) = bx;
    *(Binary **)(local_50.id + 0x20) = by;
    y_1[1].type.id = local_50.id;
  }
  else {
LAB_00ae409c:
    local_108.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_108.submatchers.curr.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_b8 = 0;
    cy = (Const *)&bx;
    local_a8 = &cy;
    local_108.binder = &local_88;
    local_c8._0_8_ = (element_type *)&y_1;
    local_a0 = &local_108;
    bVar1 = Match::Internal::
            Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            ::matches((Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                       *)&local_c8.func,curr->left);
    if (bVar1) {
      local_b8 = 0;
      local_a8 = (Const **)0x0;
      local_78 = (undefined1  [8])&by;
      local_140.binder = (matched_t<wasm::Binary_*> *)&local_50;
      local_140.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
      local_c8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_68;
      local_140.submatchers.next.curr =
           (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_78;
      local_140.submatchers.next.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
            *)&local_c8;
      bVar1 = Match::Internal::
              Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              ::matches(&local_140,curr->right);
      if (((bVar1) && (*(int *)(y_1 + 1) == *(int *)(local_50.id + 0x10))) &&
         (((bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id ==
           (by->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id &&
          ((bVar1 = Literal::operator==(&local_88->value,(Literal *)((long)local_68 + 0x10)), bVar1
           && (bVar1 = preserveAnd((OptimizeInstructions *)cx,(Binary *)y_1), bVar1)))))) {
        type.id = (bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
        op = And;
        goto LAB_00ae4190;
      }
    }
    y_1 = (Expression *)0x0;
  }
  return y_1;
}

Assistant:

Expression* combineAnd(Binary* curr) {
    assert(curr->op == AndInt32);

    using namespace Abstract;
    using namespace Match;

    {
      // (i32(x) == 0) & (i32(y) == 0)   ==>   i32(x | y) == 0
      // (i64(x) == 0) & (i64(y) == 0)   ==>   i64(x | y) == 0
      Expression *x, *y;
      if (matches(curr->left, unary(EqZ, any(&x))) &&
          matches(curr->right, unary(EqZ, any(&y))) && x->type == y->type) {
        auto* inner = curr->left->cast<Unary>();
        inner->value =
          Builder(*getModule()).makeBinary(getBinary(x->type, Or), x, y);
        return inner;
      }
    }
    {
      // Binary operations that inverse a bitwise AND can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves AND,
      // that is,
      //
      //   F(x) & F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) & binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesAnd(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise AND can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves AND,
      // that is,
      //
      //   F(x) & F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) & binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveAnd(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }